

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedSyncTextureUpdate::Run(AdvancedSyncTextureUpdate *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *textures;
  GLsizei width;
  bool bVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  GLsizei height;
  vec4 *expected;
  allocator_type local_61;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  Vector<float,_4> local_48;
  
  GVar2 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nout vec2 vs_texcoord;\nvoid main() {\n  gl_Position = i_position;\n  vs_texcoord = 0.5 + 0.5 * i_position.xy;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nwriteonly uniform image2D g_image;\nvoid main() {\n  imageStore(g_image, ivec2(gl_FragCoord.xy), gl_FragCoord);\n  discard;\n}"
                     ,(bool *)0x0);
  this->m_store_program = GVar2;
  GVar2 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nout vec2 vs_texcoord;\nvoid main() {\n  gl_Position = i_position;\n  vs_texcoord = 0.5 + 0.5 * i_position.xy;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nin vec2 vs_texcoord;\nlayout(location = 0) out vec4 o_color;\nuniform sampler2D g_sampler;\nvoid main() {\n  o_color = texture(g_sampler, vs_texcoord);\n}"
                     ,(bool *)0x0);
  this->m_draw_program = GVar2;
  tcu::Vector<float,_4>::Vector(&local_48,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&data,0x100,&local_48,&local_61);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  buffers = &this->m_pbo;
  glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
  glu::CallLogWrapper::glBindBuffer(this_00,0x88ec,*buffers);
  glu::CallLogWrapper::glBufferData
            (this_00,0x88ec,0x1000,
             data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e9);
  glu::CallLogWrapper::glBindBuffer(this_00,0x88ec,0);
  textures = &this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,1,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8814,0x10,0x10,0,0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  ShaderImageLoadStoreBase::CreateFullViewportQuad
            (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
  glu::CallLogWrapper::glViewport(this_00,0,0,0x10,0x10);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,*textures,0,'\0',0,0x88b9,0x8814);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_store_program);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x88ec,*buffers);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
  expected = (vec4 *)0x10;
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0,0,0x10,0x10,0x1908,0x1406,(void *)0x0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x88ec,0);
  iVar3 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  width = *(GLsizei *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  height = *(GLsizei *)(CONCAT44(extraout_var_00,iVar3) + 4);
  glu::CallLogWrapper::glViewport(this_00,0,0,width,height);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_draw_program);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  iVar3 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
  iVar4 = (*((this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 1.0;
  local_48.m_data[2] = 1.0;
  local_48.m_data[3] = 1.0;
  bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&this->super_ShaderImageLoadStoreBase,iVar3,
                     *(int *)(CONCAT44(extraout_var_02,iVar4) + 4),(int)&local_48,height,expected);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&data.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return (ulong)bVar1 - 1;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs =
			"#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "out vec2 vs_texcoord;" NL
			"void main() {" NL "  gl_Position = i_position;" NL "  vs_texcoord = 0.5 + 0.5 * i_position.xy;" NL "}";
		const char* const glsl_store_fs =
			"#version 420 core" NL "writeonly uniform image2D g_image;" NL "void main() {" NL
			"  imageStore(g_image, ivec2(gl_FragCoord.xy), gl_FragCoord);" NL "  discard;" NL "}";
		const char* const glsl_draw_fs =
			"#version 420 core" NL "in vec2 vs_texcoord;" NL "layout(location = 0) out vec4 o_color;" NL
			"uniform sampler2D g_sampler;" NL "void main() {" NL "  o_color = texture(g_sampler, vs_texcoord);" NL "}";
		m_store_program = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_store_fs);
		m_draw_program  = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_draw_fs);

		std::vector<vec4> data(16 * 16, vec4(1.0f));
		glGenBuffers(1, &m_pbo);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, m_pbo);
		glBufferData(GL_PIXEL_UNPACK_BUFFER, 16 * 16 * sizeof(vec4), &data[0], GL_DYNAMIC_READ);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);

		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D, m_texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 16, 16, 0, GL_RGBA, GL_FLOAT, NULL);
		glBindTexture(GL_TEXTURE_2D, 0);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glViewport(0, 0, 16, 16);
		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glUseProgram(m_store_program);
		glBindVertexArray(m_vao);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, m_pbo);
		glBindTexture(GL_TEXTURE_2D, m_texture);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 16, 16, GL_RGBA, GL_FLOAT, 0);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);

		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_draw_program);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(1, 1, 1, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}